

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall TcpSocketImpl::~TcpSocketImpl(TcpSocketImpl *this)

{
  mutex *__mutex;
  int __fd;
  bool bVar1;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpSocketImpl_001453d0;
  (this->super_BaseSocketImpl).m_bStop = true;
  __mutex = &(this->super_BaseSocketImpl).m_mxWrite;
  bVar1 = std::mutex::try_lock(__mutex);
  this->m_bCloseReq = true;
  LOCK();
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::condition_variable::notify_all();
  if (bVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if ((this->m_thConnect)._M_id._M_thread != 0) {
    std::thread::join();
  }
  __fd = (this->super_BaseSocketImpl).m_fSock;
  if (__fd != -1) {
    close(__fd);
    (this->super_BaseSocketImpl).m_fSock = -1;
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
  }
  std::_Function_base::~_Function_base(&(this->m_fClientConnectedSsl).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fBytesReceivedParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fBytesReceived).super__Function_base);
  std::__cxx11::string::~string((string *)&this->m_strIFaceAddr);
  std::__cxx11::string::~string((string *)&this->m_strClientAddr);
  std::condition_variable::~condition_variable(&this->m_cv);
  std::thread::~thread(&this->m_thConnect);
  std::_Function_base::~_Function_base(&(this->m_fClientConnectedParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fClientConnected).super__Function_base);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quOutData);
  std::_Function_base::~_Function_base(&(this->m_fnSslEncode).super__Function_base);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quInData);
  std::_Function_base::~_Function_base(&(this->m_fnSslDecode).super__Function_base);
  std::
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  ::~deque(&this->m_quTmpOutData);
  std::_Function_base::~_Function_base(&(this->m_fnSslInitDone).super__Function_base);
  BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
  return;
}

Assistant:

TcpSocketImpl::~TcpSocketImpl()
{
    //OutputDebugString(L"TcpSocketImpl::~TcpSocketImpl\r\n");
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_thConnect.joinable() == true)
        m_thConnect.join();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        StartClosingCB();
    }
}